

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::TrySimpleIntegerCast<int,true>(char *buf,idx_t len,int *result,bool strict)

{
  bool bVar1;
  undefined4 *in_RDX;
  IntegerDecimalCastData<int> cast_data;
  IntegerCastData<int> simple_data;
  IntegerDecimalCastData<int> *in_stack_ffffffffffffffb8;
  idx_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 local_28;
  undefined1 local_1;
  
  bVar1 = TryIntegerCast<duckdb::IntegerCastData<int>,true,false,duckdb::IntegerCastOperation,true,(char)46>
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     (IntegerCastData<int> *)in_stack_ffffffffffffffb8,false);
  if (bVar1) {
    *in_RDX = local_28;
    local_1 = true;
  }
  else {
    bVar1 = TryIntegerCast<duckdb::IntegerDecimalCastData<int>,true,true,duckdb::IntegerDecimalCastOperation,true,(char)46>
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                       ,false);
    if (bVar1) {
      *in_RDX = (int)in_stack_ffffffffffffffc0;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static inline bool TrySimpleIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	IntegerCastData<T> simple_data;
	if (TryIntegerCast<IntegerCastData<T>, IS_SIGNED, false, IntegerCastOperation>(buf, len, simple_data, strict)) {
		result = (T)simple_data.result;
		return true;
	}

	// Simple integer cast failed, try again with decimals/exponents included
	// FIXME: This could definitely be improved as some extra work is being done here. It is more important that
	//  "normal" integers (without exponent/decimals) are still being parsed quickly.
	IntegerDecimalCastData<T> cast_data;
	if (TryIntegerCast<IntegerDecimalCastData<T>, IS_SIGNED, true, IntegerDecimalCastOperation>(buf, len, cast_data,
	                                                                                            strict)) {
		result = (T)cast_data.result;
		return true;
	}
	return false;
}